

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvhsah.hpp
# Opt level: O1

HitInfo * __thiscall BVH::treehit(HitInfo *__return_storage_ptr__,BVH *this,Ray *ray,treenode *node)

{
  undefined4 uVar1;
  Primitive *pPVar2;
  undefined4 uVar5;
  BSDF *pBVar3;
  Object *pOVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  vec2f *uv;
  undefined3 uVar9;
  bool bVar10;
  int iVar11;
  Transparency *this_00;
  long lVar12;
  HitInfo *pHVar13;
  HitInfo *pHVar14;
  byte bVar15;
  HitInfo resr;
  HitInfo resl;
  HitInfo local_d8;
  HitInfo local_80;
  
  bVar15 = 0;
  if ((node == (treenode *)0x0) || (bVar10 = AABox::intersect(&node->bound,ray), !bVar10)) {
    (__return_storage_ptr__->super_Hit).hit = false;
    (__return_storage_ptr__->super_Hit).p.x = 0.0;
    (__return_storage_ptr__->super_Hit).p.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->super_Hit).p.z = 0;
    (__return_storage_ptr__->super_Hit).Ns.y = 0.0;
    (__return_storage_ptr__->super_Hit).Ns.z = 0.0;
    (__return_storage_ptr__->super_Hit).Ng.x = 0.0;
    (__return_storage_ptr__->super_Hit).Ng.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->super_Hit).Ng.z = 0;
    *(undefined8 *)&(__return_storage_ptr__->super_Hit).uv.y = 0;
    (__return_storage_ptr__->super_Hit).dpdu.y = 0.0;
    (__return_storage_ptr__->super_Hit).dpdu.z = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.x = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.y = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.y = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.z = 0.0;
    __return_storage_ptr__->object = (Object *)0x0;
  }
  else {
    pPVar2 = node->shape;
    if (pPVar2 == (Primitive *)0x0) {
      treehit(&local_80,this,ray,node->lc);
      if (local_80.super_Hit.hit == false) {
        treehit(__return_storage_ptr__,this,ray,node->rc);
      }
      else {
        treehit(&local_d8,this,ray,node->rc);
        pHVar13 = &local_80;
        if (local_d8.super_Hit.hit == true) {
          fVar6 = (ray->origin).x;
          fVar7 = (ray->origin).y;
          fVar8 = (ray->origin).z;
          local_80.super_Hit.p.x = local_80.super_Hit.p.x - fVar6;
          local_d8.super_Hit.p.x = local_d8.super_Hit.p.x - fVar6;
          local_80.super_Hit.p.y = local_80.super_Hit.p.y - fVar7;
          local_d8.super_Hit.p.y = local_d8.super_Hit.p.y - fVar7;
          local_80.super_Hit.p.z = local_80.super_Hit.p.z - fVar8;
          local_d8.super_Hit.p.z = local_d8.super_Hit.p.z - fVar8;
          if (local_d8.super_Hit.p.z * local_d8.super_Hit.p.z +
              local_d8.super_Hit.p.x * local_d8.super_Hit.p.x +
              local_d8.super_Hit.p.y * local_d8.super_Hit.p.y <=
              local_80.super_Hit.p.z * local_80.super_Hit.p.z +
              local_80.super_Hit.p.x * local_80.super_Hit.p.x +
              local_80.super_Hit.p.y * local_80.super_Hit.p.y) {
            pHVar13 = &local_d8;
          }
        }
        pHVar14 = __return_storage_ptr__;
        for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
          uVar9 = *(undefined3 *)&(pHVar13->super_Hit).field_0x1;
          fVar6 = (pHVar13->super_Hit).p.x;
          (pHVar14->super_Hit).hit = (pHVar13->super_Hit).hit;
          *(undefined3 *)&(pHVar14->super_Hit).field_0x1 = uVar9;
          (pHVar14->super_Hit).p.x = fVar6;
          pHVar13 = (HitInfo *)((long)pHVar13 + (ulong)bVar15 * -0x10 + 8);
          pHVar14 = (HitInfo *)((long)pHVar14 + (ulong)bVar15 * -0x10 + 8);
        }
      }
    }
    else {
      (__return_storage_ptr__->super_Hit).hit = false;
      (__return_storage_ptr__->super_Hit).p.x = 0.0;
      (__return_storage_ptr__->super_Hit).p.y = 0.0;
      *(undefined8 *)&(__return_storage_ptr__->super_Hit).p.z = 0;
      (__return_storage_ptr__->super_Hit).Ns.y = 0.0;
      (__return_storage_ptr__->super_Hit).Ns.z = 0.0;
      (__return_storage_ptr__->super_Hit).Ng.x = 0.0;
      (__return_storage_ptr__->super_Hit).Ng.y = 0.0;
      *(undefined8 *)&(__return_storage_ptr__->super_Hit).Ng.z = 0;
      *(undefined8 *)&(__return_storage_ptr__->super_Hit).uv.y = 0;
      (__return_storage_ptr__->super_Hit).dpdu.y = 0.0;
      (__return_storage_ptr__->super_Hit).dpdu.z = 0.0;
      (__return_storage_ptr__->super_Hit).dpdv.x = 0.0;
      (__return_storage_ptr__->super_Hit).dpdv.y = 0.0;
      (__return_storage_ptr__->super_Hit).dpdv.y = 0.0;
      (__return_storage_ptr__->super_Hit).dpdv.z = 0.0;
      __return_storage_ptr__->object = (Object *)0x0;
      local_80.super_Hit.hit = false;
      local_80.super_Hit.p.x = 0.0;
      local_80.super_Hit.p.y = 0.0;
      local_80.super_Hit.p.z = 0.0;
      local_80.super_Hit.Ns.x = 0.0;
      local_80.super_Hit.Ns.y = 0.0;
      local_80.super_Hit.Ns.z = 0.0;
      local_80.super_Hit.Ng.x = 0.0;
      local_80.super_Hit.Ng.y = 0.0;
      local_80.super_Hit.Ng.z = 0.0;
      local_80.super_Hit.uv.x = 0.0;
      local_80.super_Hit.uv.y = 0.0;
      local_80.super_Hit.dpdu.x = 0.0;
      local_80.super_Hit.dpdu.y = 0.0;
      local_80.super_Hit.dpdu.z = 0.0;
      local_80.super_Hit.dpdv.x = 0.0;
      local_80.super_Hit.dpdv.y = 0.0;
      local_80.super_Hit.dpdv.z = 0.0;
      uVar1 = (ray->dir).y;
      uVar5 = (ray->dir).z;
      local_d8.super_Hit._0_8_ = *(undefined8 *)&ray->origin;
      local_d8.super_Hit.p.y = (ray->origin).z;
      local_d8.super_Hit.p.z = (ray->dir).x;
      local_d8.super_Hit.Ns.x = (float)uVar1;
      local_d8.super_Hit.Ns.y = (float)uVar5;
      iVar11 = (**pPVar2->_vptr_Primitive)();
      if ((char)iVar11 != '\0') {
        pBVar3 = node->object->bsdf;
        if (pBVar3 == (BSDF *)0x0) {
          this_00 = (Transparency *)0x0;
        }
        else {
          this_00 = (Transparency *)__dynamic_cast(pBVar3,&BSDF::typeinfo,&Transparency::typeinfo,0)
          ;
        }
        if (this_00 != (Transparency *)0x0) {
          uv = &local_80.super_Hit.uv;
          bVar10 = Transparency::isTransparent(this_00,uv);
          if (bVar10) {
            do {
              local_d8.super_Hit._0_4_ = local_80.super_Hit.p.x + local_d8.super_Hit.p.z * 0.01;
              local_d8.super_Hit.p.x = local_80.super_Hit.p.y + local_d8.super_Hit.Ns.x * 0.01;
              local_d8.super_Hit.p.y = local_d8.super_Hit.Ns.y * 0.01 + local_80.super_Hit.p.z;
              iVar11 = (**node->shape->_vptr_Primitive)(node->shape,&local_d8,&local_80);
              if ((char)iVar11 == '\0') break;
              bVar10 = Transparency::isTransparent(this_00,uv);
            } while (bVar10);
            bVar10 = Transparency::isTransparent(this_00,uv);
            if (bVar10) {
              return __return_storage_ptr__;
            }
          }
        }
        pOVar4 = node->object;
        pHVar13 = &local_80;
        pHVar14 = __return_storage_ptr__;
        for (lVar12 = 0x12; lVar12 != 0; lVar12 = lVar12 + -1) {
          uVar9 = *(undefined3 *)&(pHVar13->super_Hit).field_0x1;
          (pHVar14->super_Hit).hit = (pHVar13->super_Hit).hit;
          *(undefined3 *)&(pHVar14->super_Hit).field_0x1 = uVar9;
          pHVar13 = (HitInfo *)((long)pHVar13 + ((ulong)bVar15 * -2 + 1) * 4);
          pHVar14 = (HitInfo *)((long)pHVar14 + (ulong)bVar15 * -8 + 4);
        }
        __return_storage_ptr__->object = pOVar4;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HitInfo treehit(const Ray& ray, treenode* node) {
		if (node == NULL) return HitInfo();
		if (!node->bound.intersect(ray)) return HitInfo();
		if (node->shape != NULL) {
			HitInfo hit;
			Primitive::Hit h;
			if (opaqueHit(node, ray, &h)) {
				hit = HitInfo(h, node->object);
			}
			return hit;
		}
		HitInfo resl = treehit(ray, node->lc);
		if (!resl) return treehit(ray, node->rc);
		HitInfo resr = treehit(ray, node->rc);
		return (!resr || sqrlen(resl.p - ray.origin) < sqrlen(resr.p - ray.origin))? resl: resr;
	}